

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O0

int big_file_create_records(BigFile *bf,BigRecordType *rtype,char *mode,int Nfile,size_t *fsize)

{
  int iVar1;
  undefined1 local_98 [8];
  BigBlock block [1];
  int local_3c;
  int i;
  size_t *fsize_local;
  int Nfile_local;
  char *mode_local;
  BigRecordType *rtype_local;
  BigFile *bf_local;
  
  local_3c = 0;
  do {
    if (rtype->nfield <= (ulong)(long)local_3c) {
      return 0;
    }
    iVar1 = strcmp(mode,"w+");
    if (iVar1 == 0) {
      iVar1 = big_file_create_block
                        (bf,(BigBlock *)local_98,rtype->fields[local_3c].name,
                         rtype->fields[local_3c].dtype,rtype->fields[local_3c].nmemb,Nfile,fsize);
      if (iVar1 != 0) {
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                        ,0x84);
        return -1;
      }
    }
    else {
      iVar1 = strcmp(mode,"a+");
      if (iVar1 != 0) {
        _big_file_raise("Mode string must be `a+` or `w+`, `%s` provided",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                        ,0x8f,mode);
        return -1;
      }
      iVar1 = big_file_open_block(bf,(BigBlock *)local_98,rtype->fields[local_3c].name);
      if (iVar1 != 0) {
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                        ,0x88);
        return -1;
      }
      iVar1 = big_block_grow((BigBlock *)local_98,Nfile,fsize);
      if (iVar1 != 0) {
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                        ,0x8b);
        iVar1 = big_block_close((BigBlock *)local_98);
        if (iVar1 == 0) {
          return -1;
        }
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                        ,0x98);
        return -1;
      }
    }
    iVar1 = big_block_close((BigBlock *)local_98);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                      ,0x93);
      return -1;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int
big_file_create_records(BigFile * bf,
    const BigRecordType * rtype,
    const char * mode,
    int Nfile,
    const size_t fsize[])
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigBlock block[1];
        if (0 == strcmp(mode, "w+")) {
            RAISEIF(0 != big_file_create_block(bf, block,
                             rtype->fields[i].name,
                             rtype->fields[i].dtype,
                             rtype->fields[i].nmemb,
                             Nfile,
                             fsize),
                ex_open,
                NULL);
        } else if (0 == strcmp(mode, "a+")) {
            RAISEIF(0 != big_file_open_block(bf, block, rtype->fields[i].name),
                ex_open,
                NULL);
            RAISEIF(0 != big_block_grow(block, Nfile, fsize),
                ex_grow,
                NULL);
        } else {
            RAISE(ex_open,
                "Mode string must be `a+` or `w+`, `%s` provided",
                mode);
        }
        RAISEIF(0 != big_block_close(block),
            ex_close,
            NULL);
        continue;
        ex_grow:
            RAISEIF(0 != big_block_close(block),
                ex_close,
                NULL);
        ex_open:
        ex_close:
            return -1;
    }
    return 0;
}